

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

MPP_RET __thiscall MppDevServer::bat_server_put(MppDevServer *this,MppClientType client_type)

{
  __pthread_internal_list *p_Var1;
  Mutex *this_00;
  int iVar2;
  undefined1 local_48 [8];
  AutoMutex auto_lock;
  MppDevBatServ *server;
  MppDevBatTask *n;
  MppDevBatTask *batch;
  MppClientType client_type_local;
  MppDevServer *this_local;
  
  auto_lock.mLock = (Mutex *)0x0;
  Mutex::Autolock::Autolock((Autolock *)local_48,&this->super_Mutex,1);
  if (this->mBatServer[client_type] != (MppDevBatServ *)0x0) {
    auto_lock.mLock = (Mutex *)this->mBatServer[client_type];
    this->mBatServer[client_type] = (MppDevBatServ *)0x0;
    if ((((MppDevBatServ *)auto_lock.mLock)->batch_run != 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "server->batch_run == 0","bat_server_put",0x2ea), (mpp_debug & 0x10000000) != 0))
    {
      abort();
    }
    iVar2 = list_empty((list_head *)((long)&auto_lock.mLock[1].mMutex + 0x10));
    if ((iVar2 == 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "list_empty(&server->list_batch)","bat_server_put",0x2eb),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((auto_lock.mLock[3].mMutex.__data.__kind != 0) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "server->pending_count == 0","bat_server_put",0x2ec),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (((auto_lock.mLock)->mMutex).__data.__list.__prev != (__pthread_internal_list *)0x0) {
      mpp_timer_put(((auto_lock.mLock)->mMutex).__data.__list.__prev);
      ((auto_lock.mLock)->mMutex).__data.__list.__prev = (__pthread_internal_list *)0x0;
    }
    if (*(int *)((long)&auto_lock.mLock[2].mMutex + 0x1c) == 0) {
      iVar2 = list_empty((list_head *)&auto_lock.mLock[1].mMutex.__data.__list.__next);
      if ((iVar2 == 0) &&
         (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "list_empty(&server->list_batch_free)","bat_server_put",0x2f9),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
    }
    else {
      p_Var1 = auto_lock.mLock[1].mMutex.__data.__list.__next;
      n = (MppDevBatTask *)&p_Var1[-1].__next;
      p_Var1 = p_Var1->__prev;
      while (server = (MppDevBatServ *)&p_Var1[-1].__next,
            &n->link_server != (list_head *)((long)&auto_lock.mLock[1].mMutex + 0x20)) {
        batch_del((MppDevBatServ *)auto_lock.mLock,n);
        n = (MppDevBatTask *)server;
        p_Var1 = p_Var1->__prev;
      }
    }
    if (-1 < ((auto_lock.mLock)->mMutex).__data.__owner) {
      close(((auto_lock.mLock)->mMutex).__data.__owner);
      ((auto_lock.mLock)->mMutex).__data.__owner = -1;
    }
    if (((auto_lock.mLock)->mMutex).__align != 0) {
      this_00 = (Mutex *)((auto_lock.mLock)->mMutex).__align;
      if (this_00 != (Mutex *)0x0) {
        Mutex::~Mutex(this_00);
        operator_delete(this_00,0x28);
      }
      ((auto_lock.mLock)->mMutex).__align = 0;
    }
    if (auto_lock.mLock != (Mutex *)0x0) {
      mpp_osal_free("bat_server_put",auto_lock.mLock);
    }
    auto_lock.mLock = (Mutex *)0x0;
  }
  Mutex::Autolock::~Autolock((Autolock *)local_48);
  return MPP_OK;
}

Assistant:

MPP_RET MppDevServer::bat_server_put(MppClientType client_type)
{
    MppDevBatTask *batch, *n;
    MppDevBatServ *server = NULL;
    AutoMutex auto_lock(this);

    if (NULL == mBatServer[client_type])
        return MPP_OK;

    server = mBatServer[client_type];
    mBatServer[client_type] = NULL;

    mpp_assert(server->batch_run == 0);
    mpp_assert(list_empty(&server->list_batch));
    mpp_assert(server->pending_count == 0);

    /* stop thread first */
    if (server->timer) {
        mpp_timer_put(server->timer);
        server->timer = NULL;
    }

    if (server->batch_free) {
        list_for_each_entry_safe(batch, n, &server->list_batch_free, MppDevBatTask, link_server) {
            batch_del(server, batch);
        }
    } else {
        mpp_assert(list_empty(&server->list_batch_free));
    }

    if (server->server_fd >= 0) {
        close(server->server_fd);
        server->server_fd = -1;
    }
    if (server->lock) {
        delete server->lock;
        server->lock = NULL;
    }
    MPP_FREE(server);
    return MPP_OK;
}